

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_engine.hpp
# Opt level: O0

void __thiscall
chaiscript::detail::Loadable_Module::Loadable_Module
          (Loadable_Module *this,string *t_module_name,string *t_filename)

{
  string *in_RDX;
  string *in_RSI;
  DLModule *in_RDI;
  DLSym<std::shared_ptr<chaiscript::Module>_(*)()> *unaff_retaddr;
  string local_38 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  DLModule *t_mod;
  
  t_mod = in_RDI;
  DLModule::DLModule((DLModule *)in_RSI,in_RDX);
  std::operator+((char *)in_RDX,in_stack_ffffffffffffffe0);
  DLSym<std::shared_ptr<chaiscript::Module>_(*)()>::DLSym(unaff_retaddr,t_mod,in_RSI);
  std::__cxx11::string::~string(local_38);
  (*(code *)in_RDI[1].m_data)(in_RDI + 2);
  return;
}

Assistant:

Loadable_Module(const std::string &t_module_name, const std::string &t_filename)
        : m_dlmodule(t_filename), m_func(m_dlmodule, "create_chaiscript_module_" + t_module_name),
        m_moduleptr(m_func.m_symbol())
      {
      }